

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSGetterName_abi_cxx11_
                   (GeneratorOptions *options,FieldDescriptor *field,BytesMode bytes_mode,
                   bool drop_list)

{
  bool bVar1;
  Type TVar2;
  ulong uVar3;
  string *in_RDI;
  string suffix;
  string *name;
  GeneratorOptions *in_stack_00000098;
  char *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  string *this;
  string local_70 [28];
  BytesMode in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  
  this = in_RDI;
  JSIdent_abi_cxx11_(in_stack_00000098,(FieldDescriptor *)name,options._7_1_,options._6_1_,
                     options._5_1_);
  TVar2 = FieldDescriptor::type((FieldDescriptor *)this);
  if (TVar2 == TYPE_BYTES) {
    JSByteGetterSuffix_abi_cxx11_(in_stack_ffffffffffffffac);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      std::__cxx11::string::operator+=((string *)in_RDI,local_70);
      std::__cxx11::string::~string(local_70);
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)),
                          in_stack_ffffffffffffff68);
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff76,
                                                      in_stack_ffffffffffffff70)),
                              in_stack_ffffffffffffff68), bVar1)) {
    std::__cxx11::string::operator+=((string *)in_RDI,"$");
  }
  return this;
}

Assistant:

std::string JSGetterName(const GeneratorOptions& options,
                         const FieldDescriptor* field,
                         BytesMode bytes_mode = BYTES_DEFAULT,
                         bool drop_list = false) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ true,
                             /* is_map = */ false, drop_list);
  if (field->type() == FieldDescriptor::TYPE_BYTES) {
    std::string suffix = JSByteGetterSuffix(bytes_mode);
    if (!suffix.empty()) {
      name += "_as" + suffix;
    }
  }
  if (name == "Extension" || name == "JsPbMessageId") {
    // Avoid conflicts with base-class names.
    name += "$";
  }
  return name;
}